

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcore_desktop_glfw.c
# Opt level: O2

void ClearWindowState(uint flags)

{
  if ((flags & CORE.Window.flags & 0x40) != 0) {
    glfwSwapInterval(0);
    CORE.Window.flags = CORE.Window.flags & 0xffffffbf;
  }
  if ((short)((ushort)flags & (ushort)CORE.Window.flags) < 0) {
    ToggleBorderlessWindowed();
  }
  if ((flags & CORE.Window.flags & 2) != 0) {
    ToggleFullscreen();
  }
  if ((flags & CORE.Window.flags & 4) != 0) {
    glfwSetWindowAttrib(platform.handle,0x20003,0);
    CORE.Window.flags = CORE.Window.flags & 0xfffffffb;
  }
  if ((char)((byte)flags & (byte)CORE.Window.flags) < '\0') {
    glfwShowWindow(platform.handle);
    CORE.Window.flags = CORE.Window.flags & 0xffffff7f;
  }
  if (((flags & CORE.Window.flags) >> 9 & 1) != 0) {
    RestoreWindow();
  }
  if (((flags & CORE.Window.flags) >> 10 & 1) != 0) {
    RestoreWindow();
  }
  if ((flags & CORE.Window.flags & 8) != 0) {
    glfwSetWindowAttrib(platform.handle,0x20005,1);
    CORE.Window.flags = CORE.Window.flags & 0xfffffff7;
  }
  if (((flags & CORE.Window.flags) >> 0xb & 1) != 0) {
    glfwSetWindowAttrib(platform.handle,0x2000c,1);
    CORE.Window.flags = CORE.Window.flags & 0xfffff7ff;
  }
  if (((flags & CORE.Window.flags) >> 0xc & 1) != 0) {
    glfwSetWindowAttrib(platform.handle,0x20007,0);
    CORE.Window.flags = CORE.Window.flags & 0xffffefff;
  }
  if (((flags & CORE.Window.flags) >> 8 & 1) != 0) {
    CORE.Window.flags = CORE.Window.flags & 0xfffffeff;
  }
  if ((flags & CORE.Window.flags & 0x10) != 0) {
    TraceLog(4,
             "WINDOW: Framebuffer transparency can only be configured before window initialization")
    ;
  }
  if (((flags & CORE.Window.flags) >> 0xd & 1) != 0) {
    TraceLog(4,"WINDOW: High DPI can only be configured before window initialization");
  }
  if (((flags & CORE.Window.flags) >> 0xe & 1) != 0) {
    glfwSetWindowAttrib(platform.handle,0x2000d,0);
    CORE.Window.flags = CORE.Window.flags & 0xffffbfff;
  }
  if ((flags & CORE.Window.flags & 0x20) != 0) {
    TraceLog(4,"WINDOW: MSAA can only be configured before window initialization");
  }
  if (((flags & CORE.Window.flags) >> 0x10 & 1) != 0) {
    TraceLog(4,"RPI: Interlaced mode can only be configured before window initialization");
    return;
  }
  return;
}

Assistant:

void ClearWindowState(unsigned int flags)
{
    // Check previous state and requested state to apply required changes
    // NOTE: In most cases the functions already change the flags internally

    // State change: FLAG_VSYNC_HINT
    if (((CORE.Window.flags & FLAG_VSYNC_HINT) > 0) && ((flags & FLAG_VSYNC_HINT) > 0))
    {
        glfwSwapInterval(0);
        CORE.Window.flags &= ~FLAG_VSYNC_HINT;
    }

    // State change: FLAG_BORDERLESS_WINDOWED_MODE
    // NOTE: This must be handled before FLAG_FULLSCREEN_MODE because ToggleBorderlessWindowed() needs to get some fullscreen values if fullscreen is running
    if (((CORE.Window.flags & FLAG_BORDERLESS_WINDOWED_MODE) > 0) && ((flags & FLAG_BORDERLESS_WINDOWED_MODE) > 0))
    {
        ToggleBorderlessWindowed();     // NOTE: Window state flag updated inside function
    }

    // State change: FLAG_FULLSCREEN_MODE
    if (((CORE.Window.flags & FLAG_FULLSCREEN_MODE) > 0) && ((flags & FLAG_FULLSCREEN_MODE) > 0))
    {
        ToggleFullscreen();     // NOTE: Window state flag updated inside function
    }

    // State change: FLAG_WINDOW_RESIZABLE
    if (((CORE.Window.flags & FLAG_WINDOW_RESIZABLE) > 0) && ((flags & FLAG_WINDOW_RESIZABLE) > 0))
    {
        glfwSetWindowAttrib(platform.handle, GLFW_RESIZABLE, GLFW_FALSE);
        CORE.Window.flags &= ~FLAG_WINDOW_RESIZABLE;
    }

    // State change: FLAG_WINDOW_HIDDEN
    if (((CORE.Window.flags & FLAG_WINDOW_HIDDEN) > 0) && ((flags & FLAG_WINDOW_HIDDEN) > 0))
    {
        glfwShowWindow(platform.handle);
        CORE.Window.flags &= ~FLAG_WINDOW_HIDDEN;
    }

    // State change: FLAG_WINDOW_MINIMIZED
    if (((CORE.Window.flags & FLAG_WINDOW_MINIMIZED) > 0) && ((flags & FLAG_WINDOW_MINIMIZED) > 0))
    {
        RestoreWindow();       // NOTE: Window state flag updated inside function
    }

    // State change: FLAG_WINDOW_MAXIMIZED
    if (((CORE.Window.flags & FLAG_WINDOW_MAXIMIZED) > 0) && ((flags & FLAG_WINDOW_MAXIMIZED) > 0))
    {
        RestoreWindow();       // NOTE: Window state flag updated inside function
    }

    // State change: FLAG_WINDOW_UNDECORATED
    if (((CORE.Window.flags & FLAG_WINDOW_UNDECORATED) > 0) && ((flags & FLAG_WINDOW_UNDECORATED) > 0))
    {
        glfwSetWindowAttrib(platform.handle, GLFW_DECORATED, GLFW_TRUE);
        CORE.Window.flags &= ~FLAG_WINDOW_UNDECORATED;
    }

    // State change: FLAG_WINDOW_UNFOCUSED
    if (((CORE.Window.flags & FLAG_WINDOW_UNFOCUSED) > 0) && ((flags & FLAG_WINDOW_UNFOCUSED) > 0))
    {
        glfwSetWindowAttrib(platform.handle, GLFW_FOCUS_ON_SHOW, GLFW_TRUE);
        CORE.Window.flags &= ~FLAG_WINDOW_UNFOCUSED;
    }

    // State change: FLAG_WINDOW_TOPMOST
    if (((CORE.Window.flags & FLAG_WINDOW_TOPMOST) > 0) && ((flags & FLAG_WINDOW_TOPMOST) > 0))
    {
        glfwSetWindowAttrib(platform.handle, GLFW_FLOATING, GLFW_FALSE);
        CORE.Window.flags &= ~FLAG_WINDOW_TOPMOST;
    }

    // State change: FLAG_WINDOW_ALWAYS_RUN
    if (((CORE.Window.flags & FLAG_WINDOW_ALWAYS_RUN) > 0) && ((flags & FLAG_WINDOW_ALWAYS_RUN) > 0))
    {
        CORE.Window.flags &= ~FLAG_WINDOW_ALWAYS_RUN;
    }

    // The following states can not be changed after window creation

    // State change: FLAG_WINDOW_TRANSPARENT
    if (((CORE.Window.flags & FLAG_WINDOW_TRANSPARENT) > 0) && ((flags & FLAG_WINDOW_TRANSPARENT) > 0))
    {
        TRACELOG(LOG_WARNING, "WINDOW: Framebuffer transparency can only be configured before window initialization");
    }

    // State change: FLAG_WINDOW_HIGHDPI
    if (((CORE.Window.flags & FLAG_WINDOW_HIGHDPI) > 0) && ((flags & FLAG_WINDOW_HIGHDPI) > 0))
    {
        TRACELOG(LOG_WARNING, "WINDOW: High DPI can only be configured before window initialization");
    }

    // State change: FLAG_WINDOW_MOUSE_PASSTHROUGH
    if (((CORE.Window.flags & FLAG_WINDOW_MOUSE_PASSTHROUGH) > 0) && ((flags & FLAG_WINDOW_MOUSE_PASSTHROUGH) > 0))
    {
        glfwSetWindowAttrib(platform.handle, GLFW_MOUSE_PASSTHROUGH, GLFW_FALSE);
        CORE.Window.flags &= ~FLAG_WINDOW_MOUSE_PASSTHROUGH;
    }

    // State change: FLAG_MSAA_4X_HINT
    if (((CORE.Window.flags & FLAG_MSAA_4X_HINT) > 0) && ((flags & FLAG_MSAA_4X_HINT) > 0))
    {
        TRACELOG(LOG_WARNING, "WINDOW: MSAA can only be configured before window initialization");
    }

    // State change: FLAG_INTERLACED_HINT
    if (((CORE.Window.flags & FLAG_INTERLACED_HINT) > 0) && ((flags & FLAG_INTERLACED_HINT) > 0))
    {
        TRACELOG(LOG_WARNING, "RPI: Interlaced mode can only be configured before window initialization");
    }
}